

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

complex<float> csign1(complex<float> z1,complex<float> z2)

{
  _ComplexT_conflict extraout_RAX;
  _ComplexT_conflict extraout_RAX_00;
  complex<float> cVar1;
  float fVar2;
  complex<float> z1_local;
  
  fVar2 = cabs1(z1);
  if ((fVar2 != 0.0) || (cVar1._M_value = extraout_RAX, NAN(fVar2))) {
    cabs1(z1);
    cVar1._M_value = extraout_RAX_00;
  }
  return (complex<float>)cVar1._M_value;
}

Assistant:

complex <float> csign1 ( complex <float> z1, complex <float> z2 )

//****************************************************************************80
//
//  Purpose:
//
//    CSIGN1 is a transfer-of-sign function.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    The L1 norm is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, complex <float> Z1, Z2, the arguments.
//
//    Output, complex <float> CSIGN1,  a complex value, with the magnitude of
//    Z1, and the argument of Z2.
//
{
  complex <float> value;

  if ( cabs1 ( z2 ) == 0.0 )
  {
    value = complex <float> ( 0.0, 0.0 );
  }
  else
  {
    value = cabs1 ( z1 ) * ( z2 / cabs1 ( z2 ) );
  }

  return value;
}